

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

int Gia_ManFaultAnalyze(sat_solver *pSat,Vec_Int_t *vPars,Vec_Int_t *vMap,Vec_Int_t *vLits,int Iter)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int Lit;
  timespec ts;
  uint local_60;
  uint local_5c;
  Vec_Int_t *local_58;
  uint local_50;
  int local_4c;
  long local_48;
  timespec local_40;
  
  local_50 = Iter;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (vPars->nSize != vMap->nSize) {
    __assert_fail("Vec_IntSize(vPars) == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x45f,
                  "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  vLits->nSize = 0;
  uVar4 = vMap->nSize;
  if (0 < (int)uVar4) {
    lVar6 = 0;
    do {
      Vec_IntPush(vLits,vMap->pArray[lVar6]);
      lVar6 = lVar6 + 1;
      uVar4 = vMap->nSize;
    } while (lVar6 < (int)uVar4);
  }
  uVar3 = (ulong)(uint)vPars->nSize;
  iVar9 = 0;
  iVar1 = 0;
  uVar8 = 0;
  local_58 = vMap;
  local_48 = lVar5;
  if (0 < vPars->nSize) {
    lVar5 = 0;
    local_5c = 0;
    iVar1 = 0;
    do {
      if (vLits->nSize <= lVar5) {
LAB_0053ca03:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vLits->pArray[lVar5] != 0) {
        if (vLits->pArray[lVar5] != 1) {
          __assert_fail("Vec_IntEntry(vLits, v) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                        ,0x467,
                        "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        if (vPars->pArray[lVar5] < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        local_5c = local_5c + 1;
        local_60 = vPars->pArray[lVar5] * 2;
        iVar2 = sat_solver_solve(pSat,(lit *)&local_60,(lit *)&local_5c,100,0,0,0);
        if (iVar2 == -1) {
          if (local_58->nSize <= lVar5) goto LAB_0053ca03;
          if (local_58->pArray[lVar5] != 1) {
            __assert_fail("Vec_IntEntry(vMap, v) == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                          ,0x470,
                          "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          local_58->pArray[lVar5] = 0;
          if ((int)local_60 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf4,"int Abc_LitNot(int)");
          }
          iVar1 = iVar1 + 1;
          local_60 = local_60 ^ 1;
        }
        else if (iVar2 != 0) {
          local_4c = iVar1;
          if (0 < vPars->nSize) {
            lVar6 = 0;
            do {
              if (vLits->nSize <= lVar6) goto LAB_0053ca03;
              if (vLits->pArray[lVar6] != 0) {
                iVar1 = sat_solver_var_value(pSat,vPars->pArray[lVar6]);
                if (iVar1 != 0) {
                  if (vLits->nSize <= lVar6) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                  }
                  vLits->pArray[lVar6] = 0;
                }
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < vPars->nSize);
          }
          if (vLits->nSize <= lVar5) goto LAB_0053ca03;
          iVar1 = local_4c;
          if (vLits->pArray[lVar5] != 0) {
            __assert_fail("Vec_IntEntry(vLits, v) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                          ,0x47a,
                          "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
        }
      }
      lVar5 = lVar5 + 1;
      uVar3 = (ulong)vPars->nSize;
    } while (lVar5 < (long)uVar3);
    uVar4 = local_58->nSize;
    uVar8 = (ulong)local_5c;
  }
  if (0 < (int)uVar4) {
    uVar7 = 0;
    iVar9 = 0;
    do {
      iVar9 = iVar9 + (uint)(0 < local_58->pArray[uVar7]);
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  printf("Iteration %3d has determined %5d (out of %5d) parameters after %6d SAT calls.  ",
         (ulong)local_50,(ulong)(uVar4 - iVar9),uVar3,uVar8);
  iVar2 = 3;
  iVar9 = clock_gettime(3,&local_40);
  if (iVar9 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  lVar5 = lVar5 + local_48;
  Abc_Print(iVar2,"%s =","Time");
  Abc_Print(iVar2,"%9.2f sec\n",(double)lVar5 / 1000000.0);
  return iVar1;
}

Assistant:

int Gia_ManFaultAnalyze( sat_solver * pSat, Vec_Int_t * vPars, Vec_Int_t * vMap, Vec_Int_t * vLits, int Iter )
{
    int nConfLimit = 100;
    int status, i, v, iVar, Lit;
    int nUnsats = 0, nRuns = 0;
    abctime clk = Abc_Clock();
    assert( Vec_IntSize(vPars) == Vec_IntSize(vMap) );
    // check presence of each variable
    Vec_IntClear( vLits );
    Vec_IntAppend( vLits, vMap );
    for ( v = 0; v < Vec_IntSize(vPars); v++ )
    {
        if ( !Vec_IntEntry(vLits, v) )
            continue;
        assert( Vec_IntEntry(vLits, v) == 1 );
        nRuns++;
        Lit = Abc_Var2Lit( Vec_IntEntry(vPars, v), 0 );
        status = sat_solver_solve( pSat, &Lit, &Lit+1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
            continue;
        if ( status == l_False )
        {
            nUnsats++;
            assert( Vec_IntEntry(vMap, v) == 1 );
            Vec_IntWriteEntry( vMap, v, 0 );
            Lit = Abc_LitNot(Lit);
            //status = sat_solver_addclause( pSat, &Lit, &Lit+1 );
            //assert( status );
            continue;
        }
        Vec_IntForEachEntry( vPars, iVar, i )
            if ( Vec_IntEntry(vLits, i) && sat_solver_var_value(pSat, iVar) )
                Vec_IntWriteEntry( vLits, i, 0 );
        assert( Vec_IntEntry(vLits, v) == 0 );
    }
    printf( "Iteration %3d has determined %5d (out of %5d) parameters after %6d SAT calls.  ", Iter, Vec_IntSize(vMap) - Vec_IntCountPositive(vMap), Vec_IntSize(vPars), nRuns );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return nUnsats;
}